

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_namenode_client.cc
# Opt level: O0

Future<IoctlResponse> * __thiscall
NarpcNamenodeClient::Ioctl(NarpcNamenodeClient *this,uchar op,Filename *name)

{
  int iVar1;
  long in_RSI;
  Future<IoctlResponse> *in_RDI;
  shared_ptr<NarpcIoctlResponse> response;
  shared_ptr<IoctlRequest> request;
  shared_ptr<IoctlRequest> *in_stack_ffffffffffffff28;
  shared_ptr<RpcMessage> *in_stack_ffffffffffffff30;
  shared_ptr<AsyncTask<IoctlResponse>_> *task;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Future<IoctlResponse> *__args;
  shared_ptr<AsyncTask<IoctlResponse>_> local_90;
  undefined4 local_7c;
  shared_ptr<AsyncTask<IoctlResponse>_> local_78 [3];
  long local_48;
  shared_ptr<RpcMessage> *in_stack_ffffffffffffffc0;
  shared_ptr<RpcMessage> *in_stack_ffffffffffffffc8;
  RpcClient *in_stack_ffffffffffffffd0;
  
  __args = in_RDI;
  std::make_shared<IoctlRequest,unsigned_char&,crail::Filename&>
            ((uchar *)in_RDI,
             (Filename *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  local_48 = in_RSI + 8;
  std::make_shared<NarpcIoctlResponse,RpcClient*>((RpcClient **)__args);
  std::shared_ptr<RpcMessage>::shared_ptr<IoctlRequest,void>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  task = local_78;
  std::shared_ptr<RpcMessage>::shared_ptr<NarpcIoctlResponse,void>
            (in_stack_ffffffffffffff30,(shared_ptr<NarpcIoctlResponse> *)in_stack_ffffffffffffff28);
  iVar1 = RpcClient::IssueRequest
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::shared_ptr<RpcMessage>::~shared_ptr((shared_ptr<RpcMessage> *)0x166cf7);
  std::shared_ptr<RpcMessage>::~shared_ptr((shared_ptr<RpcMessage> *)0x166d01);
  if (iVar1 < 0) {
    Future<IoctlResponse>::Failure();
  }
  else {
    std::shared_ptr<AsyncTask<IoctlResponse>>::shared_ptr<NarpcIoctlResponse,void>
              (&local_90,(shared_ptr<NarpcIoctlResponse> *)in_stack_ffffffffffffff28);
    Future<IoctlResponse>::Future
              ((Future<IoctlResponse> *)CONCAT44(iVar1,in_stack_ffffffffffffff50),task);
    std::shared_ptr<AsyncTask<IoctlResponse>_>::~shared_ptr
              ((shared_ptr<AsyncTask<IoctlResponse>_> *)0x166db4);
  }
  local_7c = 1;
  std::shared_ptr<NarpcIoctlResponse>::~shared_ptr((shared_ptr<NarpcIoctlResponse> *)0x166deb);
  std::shared_ptr<IoctlRequest>::~shared_ptr((shared_ptr<IoctlRequest> *)0x166df8);
  return in_RDI;
}

Assistant:

Future<IoctlResponse> NarpcNamenodeClient::Ioctl(unsigned char op,
                                                 Filename &name) {
  shared_ptr<IoctlRequest> request = make_shared<IoctlRequest>(op, name);
  shared_ptr<NarpcIoctlResponse> response =
      make_shared<NarpcIoctlResponse>(&rpc_client_);

  if (rpc_client_.IssueRequest(request, response) < 0) {
    return Future<IoctlResponse>::Failure();
  }
  return Future<IoctlResponse>(response);
}